

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Tokeniser.h
# Opt level: O1

bool __thiscall
soul::Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
parseStringLiteral(Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                   *this,UnicodeChar quoteChar)

{
  UTF8Reader *this_00;
  UnicodeChar UVar1;
  UnicodeChar charToWrite;
  UnicodeChar UVar2;
  uint uVar3;
  int iVar4;
  CompileMessage local_68;
  
  if ((quoteChar == 0x27) || (quoteChar == 0x22)) {
    this_00 = &this->input;
    UTF8Reader::operator++(this_00);
    std::__cxx11::string::_M_replace
              ((ulong)&this->currentStringValue,0,
               (char *)(this->currentStringValue)._M_string_length,0);
    do {
      UVar1 = UTF8Reader::getAndAdvance(this_00);
      if (UVar1 == quoteChar) break;
      charToWrite = UVar1;
      if (UVar1 == 0x5c) {
        charToWrite = UTF8Reader::getAndAdvance(this_00);
        if ((int)charToWrite < 0x6e) {
          if (charToWrite == 0x61) {
            charToWrite = 7;
          }
          else if (charToWrite == 0x62) {
            charToWrite = 8;
          }
          else if (charToWrite == 0x66) {
            charToWrite = 0xc;
          }
        }
        else {
          switch(charToWrite) {
          case 0x6e:
            charToWrite = 10;
            break;
          case 0x72:
            charToWrite = 0xd;
            break;
          case 0x74:
            charToWrite = 9;
            break;
          case 0x75:
            charToWrite = 0;
            iVar4 = -4;
            do {
              UVar2 = UTF8Reader::getAndAdvance(this_00);
              uVar3 = UVar2 - 0x30;
              if (9 < uVar3) {
                if (UVar2 - 0x61 < 6) {
                  uVar3 = UVar2 - 0x57;
                }
                else {
                  uVar3 = UVar2 - 0x37;
                  if (5 < UVar2 - 0x41) {
                    uVar3 = 0xffffffff;
                  }
                }
              }
              if ((int)uVar3 < 0) {
                (this->location).location.data = (this->input).data;
                CompileMessageHelpers::createMessage<>
                          (&local_68,syntax,error,"Syntax error in unicode escape sequence");
                (*this->_vptr_Tokeniser[2])(this,&local_68);
                RefCountedPtr<soul::SourceCodeText>::decIfNotNull
                          (local_68.location.sourceCode.object);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68.description._M_dataplus._M_p != &local_68.description.field_2) {
                  operator_delete(local_68.description._M_dataplus._M_p,
                                  local_68.description.field_2._M_allocated_capacity + 1);
                }
              }
              charToWrite = charToWrite * 0x10 + uVar3;
              iVar4 = iVar4 + 1;
            } while (iVar4 != 0);
          }
        }
      }
      if (charToWrite == 0) {
        CompileMessageHelpers::createMessage<>
                  (&local_68,syntax,error,"Unexpected end-of-input in string constant");
        (*this->_vptr_Tokeniser[2])(this,&local_68);
        RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_68.location.sourceCode.object);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68.description._M_dataplus._M_p != &local_68.description.field_2) {
          operator_delete(local_68.description._M_dataplus._M_p,
                          local_68.description.field_2._M_allocated_capacity + 1);
        }
      }
      appendUTF8(&this->currentStringValue,charToWrite);
    } while (UVar1 != quoteChar);
    checkCharacterImmediatelyAfterLiteral(this);
  }
  return quoteChar == 0x27 || quoteChar == 0x22;
}

Assistant:

bool parseStringLiteral (UnicodeChar quoteChar)
    {
        if (quoteChar != '"' && quoteChar != '\'')
            return false;

        ++input;
        currentStringValue = {};

        for (;;)
        {
            auto c = input.getAndAdvance();

            if (c == quoteChar)
                break;

            if (c == '\\')
            {
                c = input.getAndAdvance();

                switch (c)
                {
                    case '"':
                    case '\'':
                    case '\\':
                    case '/':  break;

                    case 'a':  c = '\a'; break;
                    case 'b':  c = '\b'; break;
                    case 'f':  c = '\f'; break;
                    case 'n':  c = '\n'; break;
                    case 'r':  c = '\r'; break;
                    case 't':  c = '\t'; break;

                    case 'u':
                    {
                        c = 0;

                        for (int i = 4; --i >= 0;)
                        {
                            auto digitValue = choc::text::hexDigitToInt (input.getAndAdvance());

                            if (digitValue < 0)
                            {
                                location.location = input;
                                throwError (Errors::errorInEscapeCode());
                            }

                            c = (UnicodeChar) ((c << 4) + static_cast<UnicodeChar> (digitValue));
                        }

                        break;
                    }
                }
            }

            if (c == 0)
                throwError (Errors::endOfInputInStringConstant());

            appendUTF8 (currentStringValue, c);
        }

        checkCharacterImmediatelyAfterLiteral();
        return true;
    }